

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalGenerator::QtAutoGen(cmGlobalGenerator *this)

{
  bool bVar1;
  cmQtAutoGenGlobalInitializer initializer;
  cmQtAutoGenGlobalInitializer cStack_278;
  
  cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer(&cStack_278,&this->LocalGenerators);
  bVar1 = cmQtAutoGenGlobalInitializer::generate(&cStack_278);
  cmQtAutoGenGlobalInitializer::~cmQtAutoGenGlobalInitializer(&cStack_278);
  return bVar1;
}

Assistant:

bool cmGlobalGenerator::QtAutoGen()
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmQtAutoGenGlobalInitializer initializer(this->LocalGenerators);
  return initializer.generate();
#else
  return true;
#endif
}